

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O1

cTValue * lj_ir_k64_find(jit_State *J,uint64_t u64)

{
  cTValue *pcVar1;
  cTValue *pcVar2;
  uint uVar3;
  uint32_t uVar4;
  
  uVar3 = (J->k64).ptr32;
  if (uVar3 == 0) {
    pcVar2 = (cTValue *)0x0;
  }
  else {
    do {
      pcVar2 = (cTValue *)(ulong)uVar3;
      pcVar1 = pcVar2;
      for (uVar4 = (pcVar2->field_2).it; uVar4 != 0; uVar4 = uVar4 - 1) {
        pcVar1 = pcVar1 + 1;
        if (pcVar1->u64 == u64) {
          return pcVar1;
        }
      }
      uVar3 = (pcVar2->u32).lo;
    } while (uVar3 != 0);
  }
  if ((pcVar2 == (cTValue *)0x0) || (0xf < (pcVar2->field_2).it)) {
    pcVar1 = (cTValue *)lj_mem_realloc(J->L,(void *)0x0,0,0x88);
    pcVar1->u64 = 0;
    if (pcVar2 == (cTValue *)0x0) {
      (J->k64).ptr32 = (uint32_t)pcVar1;
      pcVar2 = pcVar1;
    }
    else {
      (pcVar2->u32).lo = (uint32_t)pcVar1;
      pcVar2 = pcVar1;
    }
  }
  uVar3 = (pcVar2->field_2).it;
  (pcVar2->field_2).it = uVar3 + 1;
  pcVar2[(ulong)uVar3 + 1].u64 = u64;
  return pcVar2 + (ulong)uVar3 + 1;
}

Assistant:

cTValue *lj_ir_k64_find(jit_State *J, uint64_t u64)
{
  K64Array *k, *kp = NULL;
  TValue *ntv;
  MSize idx;
  /* Search for the constant in the whole chain of arrays. */
  for (k = mref(J->k64, K64Array); k; k = mref(k->next, K64Array)) {
    kp = k;  /* Remember previous element in list. */
    for (idx = 0; idx < k->numk; idx++) {  /* Search one array. */
      TValue *tv = &k->k[idx];
      if (tv->u64 == u64)  /* Needed for +-0/NaN/absmask. */
	return tv;
    }
  }
  /* Constant was not found, need to add it. */
  if (!(kp && kp->numk < LJ_MIN_K64SZ)) {  /* Allocate a new array. */
    K64Array *kn = lj_mem_newt(J->L, sizeof(K64Array), K64Array);
    setmref(kn->next, NULL);
    kn->numk = 0;
    if (kp)
      setmref(kp->next, kn);  /* Chain to the end of the list. */
    else
      setmref(J->k64, kn);  /* Link first array. */
    kp = kn;
  }
  ntv = &kp->k[kp->numk++];  /* Add to current array. */
  ntv->u64 = u64;
  return ntv;
}